

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

shared_ptr<helics::CommFactory::CommBuilder> * __thiscall
helics::CommFactory::MasterCommBuilder::getBuilder(MasterCommBuilder *this,string_view type)

{
  element_type *peVar1;
  pointer ptVar2;
  bool bVar3;
  int iVar4;
  shared_ptr<helics::CommFactory::MasterCommBuilder> *psVar5;
  HelicsException *this_00;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
  *builder;
  pointer ptVar6;
  pointer unaff_R15;
  pointer ptVar7;
  bool bVar8;
  string_view message;
  
  psVar5 = instance();
  peVar1 = (psVar5->
           super___shared_ptr<helics::CommFactory::MasterCommBuilder,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  ptVar2 = (peVar1->builders).
           super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar6 = (peVar1->builders).
                super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar3 = ptVar6 != ptVar2,
      ptVar7 = unaff_R15, bVar3; ptVar6 = ptVar6 + 1) {
    bVar8 = (MasterCommBuilder *)
            (ptVar6->
            super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
            ).
            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
            .
            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ._M_head_impl._M_string_length == this;
    if (bVar8 && this != (MasterCommBuilder *)0x0) {
      iVar4 = bcmp((void *)type._M_len,
                   (ptVar6->
                   super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
                   ).
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CommFactory::CommBuilder>_>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_dataplus._M_p,(size_t)this);
      bVar8 = iVar4 == 0;
    }
    ptVar7 = ptVar6;
    if (bVar8) break;
  }
  if (!bVar3) {
    this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
    message._M_str = "comm type is not available";
    message._M_len = 0x1a;
    HelicsException::HelicsException(this_00,message);
    __cxa_throw(this_00,&HelicsException::typeinfo,HelicsException::~HelicsException);
  }
  return (shared_ptr<helics::CommFactory::CommBuilder> *)ptVar7;
}

Assistant:

static const std::shared_ptr<CommBuilder>& getBuilder(std::string_view type)
        {
            for (auto& builder : instance()->builders) {
                if (std::get<1>(builder) == type) {
                    return std::get<2>(builder);
                }
            }
            throw(HelicsException("comm type is not available"));
        }